

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lldiv.c
# Opt level: O3

int main(void)

{
  lldiv_t lVar1;
  
  lVar1 = lldiv(5,2);
  if (lVar1.rem != 1 || lVar1.quot != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/lldiv.c, line %d - %s\n"
           ,0x1e,"result.quot == 2 && result.rem == 1");
  }
  lVar1 = lldiv(-5,2);
  if (lVar1.rem != -1 || lVar1.quot != -2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/lldiv.c, line %d - %s\n"
           ,0x20,"result.quot == -2 && result.rem == -1");
  }
  lVar1 = lldiv(5,-2);
  if (lVar1.rem != 1 || lVar1.quot != -2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/lldiv.c, line %d - %s\n"
           ,0x22,"result.quot == -2 && result.rem == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    lldiv_t result;
    result = lldiv( 5ll, 2ll );
    TESTCASE( result.quot == 2 && result.rem == 1 );
    result = lldiv( -5ll, 2ll );
    TESTCASE( result.quot == -2 && result.rem == -1 );
    result = lldiv( 5ll, -2ll );
    TESTCASE( result.quot == -2 && result.rem == 1 );
    TESTCASE( sizeof( result.quot ) == sizeof( long long ) );
    TESTCASE( sizeof( result.rem )  == sizeof( long long ) );
    return TEST_RESULTS;
}